

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::ByteMapBuilder::Merge(ByteMapBuilder *this)

{
  bool bVar1;
  int c_00;
  int iVar2;
  pointer ppVar3;
  ByteMapBuilder *in_RDI;
  int next_2;
  int c;
  int next_1;
  int next;
  int hi;
  int lo;
  const_iterator it;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffffb8;
  int local_34;
  int in_stack_ffffffffffffffd4;
  int c_01;
  int in_stack_fffffffffffffff4;
  ByteMapBuilder *this_00;
  
  this_00 = in_RDI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
            (in_stack_ffffffffffffffb8);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_RDI,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_stack_ffffffffffffffb8);
  do {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
              (in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x244d7e);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x244d8f);
      return;
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                           *)&stack0xfffffffffffffff0);
    c_00 = ppVar3->first + -1;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                           *)&stack0xfffffffffffffff0);
    c_01 = ppVar3->second;
    if ((-1 < c_00) && (bVar1 = Bitmap256::Test(&in_RDI->splits_,c_00), !bVar1)) {
      Bitmap256::Set(&in_RDI->splits_,c_00);
      in_stack_ffffffffffffffd4 =
           Bitmap256::FindNextSetBit((Bitmap256 *)CONCAT44(c_00,c_01),in_stack_ffffffffffffffd4);
      in_RDI->colors_[c_00] = in_RDI->colors_[in_stack_ffffffffffffffd4];
    }
    bVar1 = Bitmap256::Test(&in_RDI->splits_,c_01);
    local_34 = c_00;
    if (!bVar1) {
      Bitmap256::Set(&in_RDI->splits_,c_01);
      iVar2 = Bitmap256::FindNextSetBit((Bitmap256 *)CONCAT44(c_00,c_01),in_stack_ffffffffffffffd4);
      in_RDI->colors_[c_01] = in_RDI->colors_[iVar2];
      local_34 = c_00;
    }
    do {
      local_34 = local_34 + 1;
      if (0xff < local_34) break;
      local_34 = Bitmap256::FindNextSetBit
                           ((Bitmap256 *)CONCAT44(c_00,c_01),in_stack_ffffffffffffffd4);
      iVar2 = Recolor(this_00,in_stack_fffffffffffffff4);
      in_RDI->colors_[local_34] = iVar2;
    } while (local_34 != c_01);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  *)&stack0xfffffffffffffff0);
  } while( true );
}

Assistant:

void ByteMapBuilder::Merge() {
  for (std::vector<std::pair<int, int>>::const_iterator it = ranges_.begin();
       it != ranges_.end();
       ++it) {
    int lo = it->first-1;
    int hi = it->second;

    if (0 <= lo && !splits_.Test(lo)) {
      splits_.Set(lo);
      int next = splits_.FindNextSetBit(lo+1);
      colors_[lo] = colors_[next];
    }
    if (!splits_.Test(hi)) {
      splits_.Set(hi);
      int next = splits_.FindNextSetBit(hi+1);
      colors_[hi] = colors_[next];
    }

    int c = lo+1;
    while (c < 256) {
      int next = splits_.FindNextSetBit(c);
      colors_[next] = Recolor(colors_[next]);
      if (next == hi)
        break;
      c = next+1;
    }
  }
  colormap_.clear();
  ranges_.clear();
}